

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_Encode_Test::TestBody
          (EncodeDecodeTest_Encode_Test *this)

{
  pointer pcVar1;
  ParamType *pPVar2;
  string *filename;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  string args;
  string golden_path;
  string local_108;
  undefined1 local_e8 [8];
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [48];
  undefined1 local_48 [48];
  
  TestTempDir_abi_cxx11_();
  local_78._0_8_ = local_c8._8_8_;
  local_78._8_8_ = local_c8._0_8_;
  local_48._0_8_ = 0xf;
  local_48._8_8_ = "/golden_message";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&local_98,(lts_20250127 *)local_78,(AlphaNum *)local_48,
             (AlphaNum *)local_c8._8_8_);
  pcVar1 = local_c8 + 0x10;
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
  }
  WriteGoldenMessage((string *)&local_98);
  TestSourceDir_abi_cxx11_();
  filename = (string *)local_78;
  local_78._0_8_ = local_108._M_string_length;
  local_78._8_8_ = local_108._M_dataplus._M_p;
  local_48._0_8_ = 1;
  local_48._8_8_ = (long)"/../" + 3;
  local_c8._0_8_ = (pointer)0x48;
  local_c8._8_8_ = "google/protobuf/testdata/text_format_unittest_data_oneof_implemented.txt";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_e8,(lts_20250127 *)filename,(AlphaNum *)local_48,(AlphaNum *)local_c8,
             in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    filename = (string *)(local_108.field_2._M_allocated_capacity + 1);
    operator_delete(local_108._M_dataplus._M_p,(ulong)filename);
  }
  EncodeDecodeTest::RedirectStdinFromFile((EncodeDecodeTest *)local_e8,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
  }
  local_c8._8_8_ = (AlphaNum *)0x0;
  local_c8[0x10] = '\0';
  local_c8._0_8_ = pcVar1;
  pPVar2 = testing::
           WithParamInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
           ::GetParam();
  if (*pPVar2 != DESCRIPTOR_SET_IN) {
    std::__cxx11::string::append(local_c8);
  }
  local_78._0_8_ = local_c8._8_8_;
  local_78._8_8_ = local_c8._0_8_;
  local_48._0_8_ = (long *)0x26;
  local_48._8_8_ = " --encode=proto2_unittest.TestAllTypes";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_108,(lts_20250127 *)local_78,(AlphaNum *)local_48,(AlphaNum *)local_c8._8_8_);
  local_e8[0] = (internal)EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_108,true);
  local_e0._M_head_impl = (GTestFlagSaver *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_e8,
               (AssertionResult *)
               "Run(absl::StrCat(args, \" --encode=proto2_unittest.TestAllTypes\"))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x11c7,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((AlphaNum *)local_78._0_8_ != (AlphaNum *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if ((long *)local_48._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_48._0_8_ + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
       )local_e0._M_head_impl != (GTestFlagSaver *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_e0._M_head_impl);
  }
  EncodeDecodeTest::ExpectStdoutMatchesBinaryFile(&this->super_EncodeDecodeTest,(string *)&local_98)
  ;
  EncodeDecodeTest::ExpectNoErrors(&this->super_EncodeDecodeTest);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,
                    (ulong)(local_88._M_allocated_capacity + 1));
  }
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, Encode) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(TestUtil::GetTestDataPath(
      "google/protobuf/"
      "testdata/text_format_unittest_data_oneof_implemented.txt"));
  std::string args;
  if (GetParam() != DESCRIPTOR_SET_IN) {
    args.append("google/protobuf/unittest.proto");
  }
  EXPECT_TRUE(
      Run(absl::StrCat(args, " --encode=proto2_unittest.TestAllTypes")));
  ExpectStdoutMatchesBinaryFile(golden_path);
  ExpectNoErrors();
}